

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_com.c
# Opt level: O0

RK_S32 hal_h265d_slice_output_rps(void *dxva,void *rps_buf)

{
  undefined4 uVar1;
  undefined8 uVar2;
  byte bVar3;
  MPP_RET MVar4;
  RK_S32 RVar5;
  uint uVar6;
  RK_U32 len;
  undefined1 local_9af0 [8];
  BitputCtx_t bp;
  RK_U64 *rps_packet;
  RK_S32 fifo_len;
  RK_S32 nb_slice;
  RK_U32 RStack_9ab8;
  RK_U8 index;
  RK_U32 nb_list;
  RK_S32 _out_27;
  RK_S32 _out_26;
  RK_S32 _out_25;
  RK_S32 _out_24;
  RK_U32 _out_23;
  RK_U32 _out_22;
  RK_S32 _out_21;
  RK_S32 _out_20;
  RK_S32 _out_19;
  RK_S32 _out_18;
  RK_U32 _out_17;
  RK_S32 delta;
  RK_S32 _out_16;
  RK_S32 _out_15;
  RK_U8 lt_idx_sps;
  RK_U32 RStack_9a78;
  RK_U8 delta_poc_msb_present;
  RK_U32 _out_14;
  RK_U32 _out_13;
  RK_U32 nb_sh;
  RK_U32 nb_sps;
  RK_S32 _out_12;
  RK_S32 rps_idx;
  RK_S32 numbits;
  RK_S32 _out_11;
  RK_S32 _out_10;
  int short_term_ref_pic_set_sps_flag;
  RK_S32 _out_9;
  RK_S32 _out_8;
  RK_U32 _out_7;
  RK_S32 _out_6;
  RK_S32 _out_5;
  RK_S32 log2_ctb_size;
  RK_S32 log2_min_cb_size;
  RK_S32 ctb_height;
  RK_S32 ctb_width;
  RK_S32 height;
  RK_S32 width;
  RK_S32 slice_address_length;
  RK_U32 _out_4;
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_S32 _out;
  RefPicListTab_t ref;
  h265d_dxva2_picture_context_t *dxva_cxt;
  RK_S32 bit_begin;
  RK_U32 nb_refs;
  slice_ref_map_t rps_pic_info [600] [2] [15];
  RK_U8 lowdelay_flag [600];
  byte local_a78 [8];
  RK_U8 slice_nb_rps_poc [600];
  byte local_818 [8];
  RK_U8 rps_bit_offset_st [600];
  byte local_5b8 [8];
  RK_U8 rps_bit_offset [600];
  SliceHeader_t sh;
  BitReadCtx_t *gb;
  BitReadCtx_t gb_cxt;
  RK_S32 slice_idx;
  RK_U32 nal_type;
  RK_S32 value;
  RK_U32 k;
  RK_U32 j;
  RK_U32 i;
  void *rps_buf_local;
  void *dxva_local;
  
  gb_cxt.update_curbyte._0_4_ = 0;
  dxva_cxt._4_4_ = 0;
  ref.refPicList[1].dpb_index[0xf] = 0;
  ref.refPicList[1].nb_refs = 0;
  memset(&bit_begin,0,36000);
  memset(local_a78,0,600);
  memset(local_5b8,0,600);
  memset(local_818,0,600);
  memset(rps_pic_info[599][1] + 0xb,0,600);
  nal_type = 0;
  ref.refPicList[1]._60_8_ = dxva;
  do {
    if (*(uint *)(ref.refPicList[1]._60_8_ + 0x1e54) <= nal_type) {
      uVar6 = (int)gb_cxt.update_curbyte + 1;
      len = uVar6 * 4 + 1;
      bp._24_8_ = mpp_osal_malloc("hal_h265d_slice_output_rps",(long)(int)len << 3);
      mpp_set_bitput_ctx((BitputCtx_t *)local_9af0,(RK_U64 *)bp._24_8_,len);
      for (nal_type = 0; nal_type < uVar6; nal_type = nal_type + 1) {
        for (value = 0; (uint)value < 2; value = value + 1) {
          for (k = 0; k < 0xf; k = k + 1) {
            mpp_put_bits((BitputCtx_t *)local_9af0,
                         (ulong)*(byte *)((long)&bit_begin +
                                         (ulong)k * 2 +
                                         (ulong)(uint)value * 0x1e + (ulong)nal_type * 0x3c + 1),1);
            if ((value == 1) && (k == 4)) {
              mpp_put_align((BitputCtx_t *)local_9af0,0x40,0);
            }
            mpp_put_bits((BitputCtx_t *)local_9af0,
                         (ulong)*(byte *)((long)&bit_begin +
                                         (ulong)k * 2 +
                                         (ulong)(uint)value * 0x1e + (ulong)nal_type * 0x3c),4);
          }
        }
        mpp_put_bits((BitputCtx_t *)local_9af0,
                     (ulong)(&rps_pic_info[599][1][0xb].dpb_index)[nal_type],1);
        if ((hal_h265d_debug & 2) != 0) {
          _mpp_log_l(4,"hal_h265d_com","lowdelay_flag = %d \n",(char *)0x0,
                     (ulong)(&rps_pic_info[599][1][0xb].dpb_index)[nal_type]);
        }
        mpp_put_bits((BitputCtx_t *)local_9af0,(ulong)local_5b8[nal_type],10);
        if ((hal_h265d_debug & 2) != 0) {
          _mpp_log_l(4,"hal_h265d_com","rps_bit_offset = %d \n",(char *)0x0,
                     (ulong)local_5b8[nal_type]);
        }
        mpp_put_bits((BitputCtx_t *)local_9af0,(ulong)local_818[nal_type],9);
        if ((hal_h265d_debug & 2) != 0) {
          _mpp_log_l(4,"hal_h265d_com","rps_bit_offset_st = %d \n",(char *)0x0,
                     (ulong)local_818[nal_type]);
        }
        mpp_put_bits((BitputCtx_t *)local_9af0,(ulong)local_a78[nal_type],4);
        if ((hal_h265d_debug & 2) != 0) {
          _mpp_log_l(4,"hal_h265d_com","slice_nb_rps_poc = %d \n",(char *)0x0,
                     (ulong)local_a78[nal_type]);
        }
        mpp_put_align((BitputCtx_t *)local_9af0,0x40,0);
      }
      if (rps_buf != (void *)0x0) {
        memcpy(rps_buf,(void *)bp._24_8_,(long)(int)(uVar6 * 0x20));
      }
      mpp_osal_free("hal_h265d_slice_output_rps",(void *)bp._24_8_);
      return 0;
    }
    memset(rps_bit_offset + 0x250,0,0x2c8);
    mpp_set_bitread_ctx((BitReadCtx_t *)&gb,
                        (RK_U8 *)(*(long *)(ref.refPicList[1]._60_8_ + 0x1e60) +
                                 (ulong)*(uint *)(*(long *)(ref.refPicList[1]._60_8_ + 0x1e58) +
                                                 (ulong)nal_type * 0xc)),
                        *(RK_S32 *)
                         (*(long *)(ref.refPicList[1]._60_8_ + 0x1e58) + (ulong)nal_type * 0xc + 4))
    ;
    mpp_set_bitread_pseudo_code_type((BitReadCtx_t *)&gb,PSEUDO_CODE_H264_H265);
    sh._704_8_ = &gb;
    MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,&_out_2);
    *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
    if (*(int *)(sh._704_8_ + 0x44) != 0) {
      return -0x3ec;
    }
    if (_out_2 != 0) {
      return -0x3ec;
    }
    MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,6,&_out_3);
    *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
    if (*(int *)(sh._704_8_ + 0x44) != 0) {
      return -0x3ec;
    }
    gb_cxt.update_curbyte._4_4_ = _out_3;
    if ((uint)_out_3 < 0x18) {
      MVar4 = mpp_skip_longbits((BitReadCtx_t *)sh._704_8_,9);
      *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
      if (*(int *)(sh._704_8_ + 0x44) != 0) {
        return -0x3ec;
      }
      MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,(RK_S32 *)&_out_4);
      *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
      if (*(int *)(sh._704_8_ + 0x44) != 0) {
        return -0x3ec;
      }
      sh.slice_type._0_1_ = (undefined1)_out_4;
      if ((0xf < gb_cxt.update_curbyte._4_4_) && (gb_cxt.update_curbyte._4_4_ < 0x18)) {
        MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,&slice_address_length);
        *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
        if (*(int *)(sh._704_8_ + 0x44) != 0) {
          return -0x3ec;
        }
        sh.list_entry_lx[1][0x1e]._2_1_ = (undefined1)slice_address_length;
      }
      MVar4 = mpp_read_ue((BitReadCtx_t *)sh._704_8_,(RK_U32 *)&width);
      *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
      if (*(int *)(sh._704_8_ + 0x44) != 0) {
        return -0x3ec;
      }
      rps_bit_offset[0x250] = (undefined1)width;
      rps_bit_offset[0x251] = width._1_1_;
      rps_bit_offset[0x252] = width._2_1_;
      rps_bit_offset[0x253] = width._3_1_;
      if (0x3f < (uint)width) {
        _mpp_log_l(2,"hal_h265d_com","PPS id out of range: %d\n",(char *)0x0,(ulong)(uint)width);
        return -0x3ec;
      }
      sh.slice_type._1_1_ = B_SLICE >> 8;
      if ((undefined1)sh.slice_type == B_SLICE) {
        _out_5 = *(byte *)(ref.refPicList[1]._60_8_ + 8) + 3;
        _out_6 = _out_5 + (uint)*(byte *)(ref.refPicList[1]._60_8_ + 9);
        ctb_width = (uint)*(ushort *)ref.refPicList[1]._60_8_ << ((byte)_out_5 & 0x1f);
        ctb_height = (uint)*(ushort *)(ref.refPicList[1]._60_8_ + 2) << ((byte)_out_5 & 0x1f);
        bVar3 = (byte)_out_6;
        log2_min_cb_size = ctb_width + (1 << (bVar3 & 0x1f)) + -1 >> (bVar3 & 0x1f);
        log2_ctb_size = ctb_height + (1 << (bVar3 & 0x1f)) + -1 >> (bVar3 & 0x1f);
        if ((*(uint *)(ref.refPicList[1]._60_8_ + 0x18) >> 0x14 & 1) != 0) {
          MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,(RK_S32 *)&_out_7);
          *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
          if (*(int *)(sh._704_8_ + 0x44) != 0) {
            return -0x3ec;
          }
          sh.slice_type._1_1_ = (undefined1)_out_7;
        }
        height = mpp_ceil_log2(log2_min_cb_size * log2_ctb_size);
        MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,height,&_out_8);
        *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
        if (*(int *)(sh._704_8_ + 0x44) != 0) {
          return -0x3ec;
        }
        rps_bit_offset[0x254] = (undefined1)_out_8;
        rps_bit_offset[0x255] = _out_8._1_1_;
        rps_bit_offset[0x256] = _out_8._2_1_;
        rps_bit_offset[599] = _out_8._3_1_;
        if ((uint)(log2_min_cb_size * log2_ctb_size) <= (uint)_out_8) {
          _mpp_log_l(2,"hal_h265d_com","Invalid slice segment address: %u.\n",(char *)0x0,
                     (ulong)(uint)_out_8);
          return -0x3ec;
        }
        if (sh.slice_type._1_1_ == B_SLICE >> 8) {
          sh.pps_id = _out_8;
          gb_cxt.update_curbyte._0_4_ = (int)gb_cxt.update_curbyte + 1;
        }
      }
      else {
        sh.pps_id = 0;
        rps_bit_offset[0x254] = '\0';
        rps_bit_offset[0x255] = '\0';
        rps_bit_offset[0x256] = '\0';
        rps_bit_offset[599] = '\0';
        gb_cxt.update_curbyte._0_4_ = 0;
      }
      if (sh.slice_type._1_1_ == B_SLICE >> 8) {
        for (k = 0; k < (*(uint *)(ref.refPicList[1]._60_8_ + 0x18) >> 0x16 & 7); k = k + 1) {
          MVar4 = mpp_skip_longbits((BitReadCtx_t *)sh._704_8_,1);
          *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
          if (*(int *)(sh._704_8_ + 0x44) != 0) {
            return -0x3ec;
          }
        }
        MVar4 = mpp_read_ue((BitReadCtx_t *)sh._704_8_,(RK_U32 *)&_out_9);
        *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
        if (*(int *)(sh._704_8_ + 0x44) != 0) {
          return -0x3ec;
        }
        sh.slice_segment_addr = _out_9;
        if (((_out_9 != 2) && (_out_9 != 1)) && (_out_9 != 0)) {
          _mpp_log_l(2,"hal_h265d_com","Unknown slice type: %d.\n",(char *)0x0,(ulong)(uint)_out_9);
          return -0x3ec;
        }
        if ((*(uint *)(ref.refPicList[1]._60_8_ + 0x18) >> 0x15 & 1) != 0) {
          MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,&short_term_ref_pic_set_sps_flag);
          *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
          if (*(int *)(sh._704_8_ + 0x44) != 0) {
            return -0x3ec;
          }
          sh.slice_type._2_1_ = (undefined1)short_term_ref_pic_set_sps_flag;
        }
        if ((*(ushort *)(ref.refPicList[1]._60_8_ + 4) >> 2 & 1) != 0) {
          MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,2,&_out_10);
          *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
          if (*(int *)(sh._704_8_ + 0x44) != 0) {
            return -0x3ec;
          }
          sh.slice_type._3_1_ = (undefined1)_out_10;
        }
        if ((gb_cxt.update_curbyte._4_4_ == 0x13) || (gb_cxt.update_curbyte._4_4_ == 0x14)) {
          sh.slice_rps.used[0x18] = '\0';
          sh.slice_rps.used[0x19] = '\0';
          sh.slice_rps.used[0x1a] = '\0';
          sh.slice_rps.used[0x1b] = '\0';
          sh.slice_rps.used[0x1c] = '\0';
          sh.slice_rps.used[0x1d] = '\0';
          sh.slice_rps.used[0x1e] = '\0';
          sh.slice_rps.used[0x1f] = '\0';
        }
        else {
          MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,
                                (*(ushort *)(ref.refPicList[1]._60_8_ + 4) >> 9 & 0xf) + 4,&numbits)
          ;
          *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
          if (*(int *)(sh._704_8_ + 0x44) != 0) {
            return -0x3ec;
          }
          sh.slice_addr = numbits;
          MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,&rps_idx);
          *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
          if (*(int *)(sh._704_8_ + 0x44) != 0) {
            return -0x3ec;
          }
          _out_11 = rps_idx;
          uVar1 = *(undefined4 *)(sh._704_8_ + 0x30);
          if (rps_idx == 0) {
            MVar4 = mpp_skip_longbits((BitReadCtx_t *)sh._704_8_,
                                      (uint)*(ushort *)(ref.refPicList[1]._60_8_ + 0x14));
            *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
            if (*(int *)(sh._704_8_ + 0x44) != 0) {
              return -0x3ec;
            }
          }
          else {
            if (*(char *)(ref.refPicList[1]._60_8_ + 0xe) == '\0') {
              _mpp_log_l(2,"hal_h265d_com","No ref lists in the SPS.\n",(char *)0x0);
              return -0x3ec;
            }
            _out_12 = mpp_ceil_log2((uint)*(byte *)(ref.refPicList[1]._60_8_ + 0xe));
            nb_sps = 0;
            if (0 < _out_12) {
              MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,_out_12,(RK_S32 *)&nb_sh);
              *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
              if (*(int *)(sh._704_8_ + 0x44) != 0) {
                return -0x3ec;
              }
              nb_sps = nb_sh;
            }
          }
          local_818[(int)gb_cxt.update_curbyte] =
               (char)*(undefined4 *)(sh._704_8_ + 0x30) - (char)uVar1;
          local_5b8[(int)gb_cxt.update_curbyte] = local_818[(int)gb_cxt.update_curbyte];
          if ((*(uint *)(ref.refPicList[1]._60_8_ + 0x18) >> 0x11 & 1) != 0) {
            _out_13 = 0;
            uVar1 = *(undefined4 *)(sh._704_8_ + 0x30);
            if (*(char *)(ref.refPicList[1]._60_8_ + 0xf) != '\0') {
              MVar4 = mpp_read_ue((BitReadCtx_t *)sh._704_8_,&stack0xffffffffffff6588);
              *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
              if (*(int *)(sh._704_8_ + 0x44) != 0) {
                return -0x3ec;
              }
              _out_13 = RStack_9a78;
            }
            MVar4 = mpp_read_ue((BitReadCtx_t *)sh._704_8_,(RK_U32 *)&_out_15);
            *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
            if (*(int *)(sh._704_8_ + 0x44) != 0) {
              return -0x3ec;
            }
            _out_14 = _out_15;
            dxva_cxt._4_4_ = _out_15 + _out_13;
            for (k = 0; uVar2 = sh._704_8_, k < dxva_cxt._4_4_; k = k + 1) {
              if (k < _out_13) {
                _out_16._2_1_ = 0;
                if (1 < *(byte *)(ref.refPicList[1]._60_8_ + 0xf)) {
                  RVar5 = mpp_ceil_log2((uint)*(byte *)(ref.refPicList[1]._60_8_ + 0xf));
                  MVar4 = mpp_read_bits((BitReadCtx_t *)uVar2,RVar5,&delta);
                  *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
                  if (*(int *)(sh._704_8_ + 0x44) != 0) {
                    return -0x3ec;
                  }
                  _out_16._2_1_ = (undefined1)delta;
                }
              }
              else {
                MVar4 = mpp_skip_longbits((BitReadCtx_t *)sh._704_8_,
                                          (*(ushort *)(ref.refPicList[1]._60_8_ + 4) >> 9 & 0xf) + 4
                                         );
                *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
                if (*(int *)(sh._704_8_ + 0x44) != 0) {
                  return -0x3ec;
                }
                MVar4 = mpp_skip_longbits((BitReadCtx_t *)sh._704_8_,1);
                *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
                if (*(int *)(sh._704_8_ + 0x44) != 0) {
                  return -0x3ec;
                }
              }
              MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,(RK_S32 *)&_out_17);
              *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
              if (*(int *)(sh._704_8_ + 0x44) != 0) {
                return -0x3ec;
              }
              _out_16._3_1_ = (char)_out_17;
              if (_out_16._3_1_ != '\0') {
                _out_18 = 0;
                MVar4 = mpp_read_ue((BitReadCtx_t *)sh._704_8_,(RK_U32 *)&_out_19);
                *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
                if (*(int *)(sh._704_8_ + 0x44) != 0) {
                  return -0x3ec;
                }
                _out_18 = _out_19;
              }
            }
            local_5b8[(int)gb_cxt.update_curbyte] =
                 local_5b8[(int)gb_cxt.update_curbyte] +
                 ((char)*(undefined4 *)(sh._704_8_ + 0x30) - (char)uVar1);
          }
          if ((*(uint *)(ref.refPicList[1]._60_8_ + 0x18) >> 0x12 & 1) == 0) {
            sh.list_entry_lx[1][0x1e]._3_1_ = 0;
          }
          else {
            MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,&_out_20);
            *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
            if (*(int *)(sh._704_8_ + 0x44) != 0) {
              return -0x3ec;
            }
            sh.list_entry_lx[1][0x1e]._3_1_ = (undefined1)_out_20;
          }
        }
        if ((*(uint *)(ref.refPicList[1]._60_8_ + 0x18) >> 2 & 1) == 0) {
          sh.nb_refs[0]._0_1_ = 0;
          sh.nb_refs[0]._2_1_ = 0;
        }
        else {
          MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,&_out_21);
          *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
          if (*(int *)(sh._704_8_ + 0x44) != 0) {
            return -0x3ec;
          }
          sh.nb_refs[0]._0_1_ = (undefined1)_out_21;
          MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,(RK_S32 *)&_out_22);
          *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
          if (*(int *)(sh._704_8_ + 0x44) != 0) {
            return -0x3ec;
          }
          sh.nb_refs[0]._2_1_ = (undefined1)_out_22;
        }
        sh.rpl_modification_flag[0] = '\0';
        sh.rpl_modification_flag[1] = '\0';
        sh.no_output_of_prior_pics_flag = '\0';
        sh.slice_temporal_mvp_enabled_flag = '\0';
        sh.list_entry_lx[1][0x1f] = 0;
        sh.nb_refs[0]._1_1_ = sh.nb_refs[0]._2_1_;
        if ((sh.slice_segment_addr == 1) || (sh.slice_segment_addr == 0)) {
          sh.list_entry_lx[1][0x1f] = *(byte *)(ref.refPicList[1]._60_8_ + 0x10) + 1;
          if (sh.slice_segment_addr == 0) {
            sh._620_4_ = *(byte *)(ref.refPicList[1]._60_8_ + 0x11) + 1;
          }
          MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,(RK_S32 *)&_out_23);
          *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
          if (*(int *)(sh._704_8_ + 0x44) != 0) {
            return -0x3ec;
          }
          if (_out_23 != 0) {
            MVar4 = mpp_read_ue((BitReadCtx_t *)sh._704_8_,(RK_U32 *)&_out_24);
            *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
            if (*(int *)(sh._704_8_ + 0x44) != 0) {
              return -0x3ec;
            }
            sh.list_entry_lx[1][0x1f] = _out_24 + 1;
            if (sh.slice_segment_addr == 0) {
              MVar4 = mpp_read_ue((BitReadCtx_t *)sh._704_8_,(RK_U32 *)&_out_25);
              *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
              if (*(int *)(sh._704_8_ + 0x44) != 0) {
                return -0x3ec;
              }
              sh._620_4_ = _out_25 + 1;
            }
          }
          if ((0x10 < sh.list_entry_lx[1][0x1f]) || (0x10 < (uint)sh._620_4_)) {
            _mpp_log_l(2,"hal_h265d_com","Too many refs: %d/%d.\n",(char *)0x0,
                       (ulong)sh.list_entry_lx[1][0x1f],(ulong)(uint)sh._620_4_);
            return -0x3ec;
          }
          sh.list_entry_lx[1][0x1e]._0_1_ = '\0';
          sh.list_entry_lx[1][0x1e]._1_1_ = '\0';
          dxva_cxt._4_4_ = 0;
          for (k = 0; k < 0xf; k = k + 1) {
            if (*(char *)(ref.refPicList[1]._60_8_ + 0x7c + (ulong)k) != -1) {
              if ((hal_h265d_debug & 2) != 0) {
                _mpp_log_l(4,"hal_h265d_com","dxva_cxt->pp.RefPicList[i].bPicEntry = %d",(char *)0x0
                           ,(ulong)*(byte *)(ref.refPicList[1]._60_8_ + 0x7c + (ulong)k));
              }
              dxva_cxt._4_4_ = dxva_cxt._4_4_ + 1;
            }
          }
          if (dxva_cxt._4_4_ == 0) {
            _mpp_log_l(2,"hal_h265d_com","Zero refs for a frame with P or B slices.\n",(char *)0x0);
            return -0x3ec;
          }
          if (((*(uint *)(ref.refPicList[1]._60_8_ + 0x1c) >> 0xe & 1) != 0) && (1 < dxva_cxt._4_4_)
             ) {
            MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,&_out_26);
            *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
            if (*(int *)(sh._704_8_ + 0x44) != 0) {
              return -0x3ec;
            }
            sh.list_entry_lx[1][0x1e]._0_1_ = (char)_out_26;
            if ((char)sh.list_entry_lx[1][0x1e] != '\0') {
              for (k = 0; uVar2 = sh._704_8_, k < sh.list_entry_lx[1][0x1f]; k = k + 1) {
                RVar5 = mpp_ceil_log2(dxva_cxt._4_4_);
                MVar4 = mpp_read_bits((BitReadCtx_t *)uVar2,RVar5,&_out_27);
                *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
                if (*(int *)(sh._704_8_ + 0x44) != 0) {
                  return -0x3ec;
                }
                *(RK_S32 *)((long)(sh.list_entry_lx + -1) + ((ulong)k + 0x1e) * 4) = _out_27;
              }
            }
            if (sh.slice_segment_addr == 0) {
              MVar4 = mpp_read_bits((BitReadCtx_t *)sh._704_8_,1,(RK_S32 *)&nb_list);
              *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
              if (*(int *)(sh._704_8_ + 0x44) != 0) {
                return -0x3ec;
              }
              sh.list_entry_lx[1][0x1e]._1_1_ = (char)nb_list;
              if (sh.list_entry_lx[1][0x1e]._1_1_ == '\x01') {
                for (k = 0; uVar2 = sh._704_8_, k < (uint)sh._620_4_; k = k + 1) {
                  RVar5 = mpp_ceil_log2(dxva_cxt._4_4_);
                  MVar4 = mpp_read_bits((BitReadCtx_t *)uVar2,RVar5,
                                        (RK_S32 *)&stack0xffffffffffff6548);
                  *(MPP_RET *)(sh._704_8_ + 0x44) = MVar4;
                  if (*(int *)(sh._704_8_ + 0x44) != 0) {
                    return -0x3ec;
                  }
                  sh.list_entry_lx[0][(ulong)k + 0x1e] = RStack_9ab8;
                }
              }
            }
          }
        }
      }
      if ((sh.slice_type._1_1_ == B_SLICE >> 8) && (sh.slice_segment_addr != 2)) {
        uVar6 = 2 - sh.slice_segment_addr;
        hal_h265d_slice_rpl(dxva,(SliceHeader_t *)(rps_bit_offset + 0x250),
                            (RefPicListTab_t *)&_out_1);
        (&rps_pic_info[599][1][0xb].dpb_index)[(int)gb_cxt.update_curbyte] = '\x01';
        for (value = 0; (uint)value < uVar6; value = value + 1) {
          for (k = 0; k < ref.refPicList[(uint)value].dpb_index[0xe]; k = k + 1) {
            bVar3 = (byte)(&_out_1)[(ulong)(uint)value * 0x11 + (ulong)k];
            if (bVar3 != 0xff) {
              *(byte *)((long)&bit_begin +
                       (ulong)k * 2 +
                       (ulong)(uint)value * 0x1e + (long)(int)gb_cxt.update_curbyte * 0x3c) = bVar3;
              *(byte *)((long)&bit_begin +
                       (ulong)k * 2 +
                       (ulong)(uint)value * 0x1e + (long)(int)gb_cxt.update_curbyte * 0x3c + 1) =
                   *(byte *)(ref.refPicList[1]._60_8_ + 0x7c + (ulong)bVar3) >> 7;
              if (*(int *)(ref.refPicList[1]._60_8_ + 0x78) <
                  *(int *)(ref.refPicList[1]._60_8_ + 0x8c + (ulong)bVar3 * 4)) {
                (&rps_pic_info[599][1][0xb].dpb_index)[(int)gb_cxt.update_curbyte] = '\0';
              }
            }
          }
        }
        if (sh.slice_segment_addr == 2) {
          local_a78[(int)gb_cxt.update_curbyte] = 0;
        }
        else {
          local_a78[(int)gb_cxt.update_curbyte] = (byte)dxva_cxt._4_4_;
        }
      }
    }
    nal_type = nal_type + 1;
  } while( true );
}

Assistant:

RK_S32 hal_h265d_slice_output_rps(void *dxva, void *rps_buf)
{
    RK_U32 i, j, k;
    RK_S32 value;
    RK_U32 nal_type;
    RK_S32 slice_idx = 0;
    BitReadCtx_t gb_cxt, *gb;
    SliceHeader_t sh;
    RK_U8     rps_bit_offset[600];
    RK_U8     rps_bit_offset_st[600];
    RK_U8     slice_nb_rps_poc[600];
    RK_U8     lowdelay_flag[600];
    slice_ref_map_t rps_pic_info[600][2][15];
    RK_U32    nb_refs = 0;
    RK_S32    bit_begin;
    h265d_dxva2_picture_context_t *dxva_cxt = NULL;

    memset(&rps_pic_info,   0, sizeof(rps_pic_info));
    memset(&slice_nb_rps_poc, 0, sizeof(slice_nb_rps_poc));
    memset(&rps_bit_offset, 0, sizeof(rps_bit_offset));
    memset(&rps_bit_offset_st, 0, sizeof(rps_bit_offset_st));
    memset(&lowdelay_flag, 0, sizeof(lowdelay_flag));

    dxva_cxt = (h265d_dxva2_picture_context_t*)dxva;
    for (k = 0; k < dxva_cxt->slice_count; k++) {
        RefPicListTab_t ref;
        memset(&sh, 0, sizeof(SliceHeader_t));
        // mpp_err("data[%d]= 0x%x,size[%d] = %d \n",
        //   k,dxva_cxt->slice_short[k].BSNALunitDataLocation, k,dxva_cxt->slice_short[k].SliceBytesInBuffer);
        mpp_set_bitread_ctx(&gb_cxt, (RK_U8*)(dxva_cxt->bitstream + dxva_cxt->slice_short[k].BSNALunitDataLocation),
                            dxva_cxt->slice_short[k].SliceBytesInBuffer);

        mpp_set_bitread_pseudo_code_type(&gb_cxt, PSEUDO_CODE_H264_H265);
        gb = &gb_cxt;

        READ_ONEBIT(gb, &value);

        if ( value != 0)
            return  MPP_ERR_STREAM;

        READ_BITS(gb, 6, &nal_type);

        if (nal_type > 23) {
            continue;
        }

        SKIP_BITS(gb, 9);

        READ_ONEBIT(gb, &sh.first_slice_in_pic_flag);

        if (nal_type >= 16 && nal_type <= 23)
            READ_ONEBIT(gb, &sh.no_output_of_prior_pics_flag);

        READ_UE(gb, &sh.pps_id);

        if (sh.pps_id >= 64 ) {
            mpp_err( "PPS id out of range: %d\n", sh.pps_id);
            return  MPP_ERR_STREAM;
        }

        sh.dependent_slice_segment_flag = 0;
        if (!sh.first_slice_in_pic_flag) {
            RK_S32 slice_address_length;
            RK_S32 width, height, ctb_width, ctb_height;
            RK_S32 log2_min_cb_size = dxva_cxt->pp.log2_min_luma_coding_block_size_minus3 + 3;
            RK_S32 log2_ctb_size = log2_min_cb_size + dxva_cxt->pp.log2_diff_max_min_luma_coding_block_size;

            width = (dxva_cxt->pp.PicWidthInMinCbsY << log2_min_cb_size);
            height = (dxva_cxt->pp.PicHeightInMinCbsY << log2_min_cb_size);

            ctb_width  = (width  + (1 << log2_ctb_size) - 1) >> log2_ctb_size;
            ctb_height = (height + (1 << log2_ctb_size) - 1) >> log2_ctb_size;

            if (dxva_cxt->pp.dependent_slice_segments_enabled_flag)
                READ_ONEBIT(gb, &sh.dependent_slice_segment_flag);

            slice_address_length = mpp_ceil_log2(ctb_width * ctb_height);

            READ_BITS(gb, slice_address_length, &sh.slice_segment_addr);

            if (sh.slice_segment_addr >= (RK_U32)(ctb_width * ctb_height)) {
                mpp_err(
                    "Invalid slice segment address: %u.\n",
                    sh.slice_segment_addr);
                return  MPP_ERR_STREAM;
            }

            if (!sh.dependent_slice_segment_flag) {
                sh.slice_addr = sh.slice_segment_addr;
                slice_idx++;
            }
        } else {
            sh.slice_segment_addr = sh.slice_addr = 0;
            slice_idx           = 0;
        }

        if (!sh.dependent_slice_segment_flag) {
            for (i = 0; i < dxva_cxt->pp.num_extra_slice_header_bits; i++)
                SKIP_BITS(gb, 1);

            READ_UE(gb, &sh.slice_type);
            if (!(sh.slice_type == I_SLICE ||
                  sh.slice_type == P_SLICE ||
                  sh.slice_type == B_SLICE)) {
                mpp_err( "Unknown slice type: %d.\n",
                         sh.slice_type);
                return  MPP_ERR_STREAM;
            }
            /*     if (!s->decoder_id && IS_IRAP(nal_type) && sh->slice_type != I_SLICE) {
                     mpp_err( "Inter slices in an IRAP frame.\n");
                     return  MPP_ERR_STREAM;
                 }*/

            if (dxva_cxt->pp.output_flag_present_flag)
                READ_ONEBIT(gb, &sh.pic_output_flag);

            if (dxva_cxt->pp.separate_colour_plane_flag)
                READ_BITS(gb, 2, &sh.colour_plane_id );

            if (!IS_IDR(nal_type)) {
                int short_term_ref_pic_set_sps_flag;

                READ_BITS(gb, (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4), &sh.pic_order_cnt_lsb);

                READ_ONEBIT(gb, &short_term_ref_pic_set_sps_flag);

                bit_begin = gb->used_bits;

                if (!short_term_ref_pic_set_sps_flag) {
                    SKIP_BITS(gb, dxva_cxt->pp.wNumBitsForShortTermRPSInSlice);
                } else {
                    RK_S32 numbits, rps_idx;
                    if (!dxva_cxt->pp.num_short_term_ref_pic_sets) {
                        mpp_err( "No ref lists in the SPS.\n");
                        return  MPP_ERR_STREAM;
                    }
                    numbits = mpp_ceil_log2(dxva_cxt->pp.num_short_term_ref_pic_sets);
                    rps_idx = 0;
                    if (numbits > 0)
                        READ_BITS(gb, numbits, &rps_idx);
                }

                rps_bit_offset_st[slice_idx] = gb->used_bits - bit_begin;
                rps_bit_offset[slice_idx] = rps_bit_offset_st[slice_idx];
                if (dxva_cxt->pp.long_term_ref_pics_present_flag) {

//                    RK_S32 max_poc_lsb    = 1 << (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4);
                    RK_U32 nb_sps = 0, nb_sh;

                    bit_begin = gb->used_bits;
                    if (dxva_cxt->pp.num_long_term_ref_pics_sps > 0)
                        READ_UE(gb, &nb_sps);

                    READ_UE(gb, &nb_sh);

                    nb_refs = nb_sh + nb_sps;

                    for (i = 0; i < nb_refs; i++) {
                        RK_U8 delta_poc_msb_present;

                        if ((RK_U32)i < nb_sps) {
                            RK_U8 lt_idx_sps = 0;

                            if (dxva_cxt->pp.num_long_term_ref_pics_sps > 1)
                                READ_BITS(gb, mpp_ceil_log2(dxva_cxt->pp.num_long_term_ref_pics_sps), &lt_idx_sps);
                        } else {
                            SKIP_BITS(gb, (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4));
                            SKIP_BITS(gb, 1);
                        }

                        READ_ONEBIT(gb, &delta_poc_msb_present);
                        if (delta_poc_msb_present) {
                            RK_S32 delta = 0;
                            READ_UE(gb, &delta);
                        }
                    }
                    rps_bit_offset[slice_idx] += (gb->used_bits - bit_begin);

                }

                if (dxva_cxt->pp.sps_temporal_mvp_enabled_flag)
                    READ_ONEBIT(gb, &sh.slice_temporal_mvp_enabled_flag);
                else
                    sh.slice_temporal_mvp_enabled_flag = 0;
            } else {
                sh.short_term_rps = NULL;
            }

            if (dxva_cxt->pp.sample_adaptive_offset_enabled_flag) {
                READ_ONEBIT(gb, &sh.slice_sample_adaptive_offset_flag[0]);
                READ_ONEBIT(gb, &sh.slice_sample_adaptive_offset_flag[1]);
                sh.slice_sample_adaptive_offset_flag[2] =
                    sh.slice_sample_adaptive_offset_flag[1];
            } else {
                sh.slice_sample_adaptive_offset_flag[0] = 0;
                sh.slice_sample_adaptive_offset_flag[1] = 0;
                sh.slice_sample_adaptive_offset_flag[2] = 0;
            }

            sh.nb_refs[L0] = sh.nb_refs[L1] = 0;
            if (sh.slice_type == P_SLICE || sh.slice_type == B_SLICE) {

                sh.nb_refs[L0] = dxva_cxt->pp.num_ref_idx_l0_default_active_minus1 + 1;
                if (sh.slice_type == B_SLICE)
                    sh.nb_refs[L1] =  dxva_cxt->pp.num_ref_idx_l1_default_active_minus1 + 1;

                READ_ONEBIT(gb, &value);

                if (value) { // num_ref_idx_active_override_flag
                    READ_UE(gb, &sh.nb_refs[L0]);
                    sh.nb_refs[L0] += 1;
                    if (sh.slice_type == B_SLICE) {
                        READ_UE(gb, &sh.nb_refs[L1]);
                        sh.nb_refs[L1] += 1;
                    }
                }
                if (sh.nb_refs[L0] > MAX_REFS || sh.nb_refs[L1] > MAX_REFS) {
                    mpp_err( "Too many refs: %d/%d.\n",
                             sh.nb_refs[L0], sh.nb_refs[L1]);
                    return  MPP_ERR_STREAM;
                }

                sh.rpl_modification_flag[0] = 0;
                sh.rpl_modification_flag[1] = 0;
                nb_refs = 0;
                for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dxva_cxt->pp.RefPicList); i++) {
                    if (dxva_cxt->pp.RefPicList[i].bPicEntry != 0xff) {
                        h265h_dbg(H265H_DBG_RPS, "dxva_cxt->pp.RefPicList[i].bPicEntry = %d", dxva_cxt->pp.RefPicList[i].bPicEntry);
                        nb_refs++;
                    }
                }

                if (!nb_refs) {
                    mpp_err( "Zero refs for a frame with P or B slices.\n");
                    return  MPP_ERR_STREAM;
                }

                if (dxva_cxt->pp.lists_modification_present_flag && nb_refs > 1) {
                    READ_ONEBIT(gb, &sh.rpl_modification_flag[0]);
                    if (sh.rpl_modification_flag[0]) {
                        for (i = 0; (RK_U32)i < sh.nb_refs[L0]; i++)
                            READ_BITS(gb, mpp_ceil_log2(nb_refs), &sh.list_entry_lx[0][i]);
                    }

                    if (sh.slice_type == B_SLICE) {
                        READ_ONEBIT(gb, &sh.rpl_modification_flag[1]);
                        if (sh.rpl_modification_flag[1] == 1)
                            for (i = 0; (RK_U32)i < sh.nb_refs[L1]; i++)
                                READ_BITS(gb, mpp_ceil_log2(nb_refs), &sh.list_entry_lx[1][i]);
                    }
                }
            }
        }

        if (!sh.dependent_slice_segment_flag &&
            sh.slice_type != I_SLICE) {
            RK_U32 nb_list = I_SLICE - sh.slice_type;

            hal_h265d_slice_rpl(dxva, &sh, &ref);
            lowdelay_flag[slice_idx]  =  1;

            for (j = 0; j < nb_list; j++) {
                for (i = 0; i < ref.refPicList[j].nb_refs; i++) {
                    RK_U8 index = 0;
                    index = ref.refPicList[j].dpb_index[i];
                    // mpp_err("slice_idx = %d index = %d,j = %d i = %d",slice_idx,index,j,i);
                    if (index != 0xff) {
                        rps_pic_info[slice_idx][j][i].dpb_index = index;
                        rps_pic_info[slice_idx][j][i].is_long_term
                            = dxva_cxt->pp.RefPicList[index].AssociatedFlag;
                        if (dxva_cxt->pp.PicOrderCntValList[index] > dxva_cxt->pp.CurrPicOrderCntVal)
                            lowdelay_flag[slice_idx] = 0;
                    }
                }
            }

            if (sh.slice_type == I_SLICE)
                slice_nb_rps_poc[slice_idx] = 0;
            else
                slice_nb_rps_poc[slice_idx] = nb_refs;

        }
    }
//out put for rk format
    {
        RK_S32  nb_slice = slice_idx + 1;
        RK_S32  fifo_len   = nb_slice * 4 + 1;//size of rps_packet alloc more 1 64 bit invoid buffer no enought
        RK_U64 *rps_packet = mpp_malloc(RK_U64, fifo_len);
        BitputCtx_t bp;
        mpp_set_bitput_ctx(&bp, rps_packet, fifo_len);
        for (k = 0; k < (RK_U32)nb_slice; k++) {
            for (j = 0; j < 2; j++) {
                for (i = 0; i < 15; i++) {
                    mpp_put_bits(&bp, rps_pic_info[k][j][i].is_long_term, 1);
                    if (j == 1 && i == 4) {
                        mpp_put_align (&bp, 64, 0);
                    }
                    mpp_put_bits(&bp, rps_pic_info[k][j][i].dpb_index,    4);
                }
            }
            mpp_put_bits(&bp, lowdelay_flag      [k], 1);
            h265h_dbg(H265H_DBG_RPS, "lowdelay_flag = %d \n", lowdelay_flag[k]);
            mpp_put_bits(&bp, rps_bit_offset     [k], 10);

            h265h_dbg(H265H_DBG_RPS, "rps_bit_offset = %d \n", rps_bit_offset[k]);
            mpp_put_bits(&bp, rps_bit_offset_st  [k], 9);

            h265h_dbg(H265H_DBG_RPS, "rps_bit_offset_st = %d \n", rps_bit_offset_st[k]);
            mpp_put_bits(&bp, slice_nb_rps_poc   [k], 4);

            h265h_dbg(H265H_DBG_RPS, "slice_nb_rps_poc = %d \n", slice_nb_rps_poc[k]);
            mpp_put_align   (&bp, 64, 0);
        }
        if (rps_buf != NULL) {
            memcpy(rps_buf, rps_packet, nb_slice * 32);
        }
        mpp_free(rps_packet);
    }

    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}